

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.h
# Opt level: O2

void __thiscall
Js::JavascriptError::JavascriptError
          (JavascriptError *this,DynamicType *type,BOOL isExternalError,BOOL isPrototype)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01397708;
  this->isExternalError = isExternalError;
  this->isPrototype = isPrototype;
  this->isStackPropertyRedefined = false;
  (this->originalRuntimeErrorMessage).ptr = (char16_t *)0x0;
  (this->exceptionObject).ptr = (JavascriptExceptionObject *)0x0;
  if ((type->super_Type).typeId != TypeIds_Error) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptError.h"
                                ,0x20,"(type->GetTypeId() == TypeIds_Error)",
                                "type->GetTypeId() == TypeIds_Error");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->exceptionObject).ptr = (JavascriptExceptionObject *)0x0;
  this->m_errorType = kjstCustomError;
  return;
}

Assistant:

JavascriptError(DynamicType* type, BOOL isExternalError = FALSE, BOOL isPrototype = FALSE) :
            DynamicObject(type), originalRuntimeErrorMessage(nullptr), isExternalError(isExternalError), isPrototype(isPrototype), isStackPropertyRedefined(false)
        {
            Assert(type->GetTypeId() == TypeIds_Error);
            exceptionObject = nullptr;
            m_errorType = kjstCustomError;
        }